

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIStaticText::breakText(CGUIStaticText *this)

{
  undefined1 *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  u32 begin;
  long *plVar5;
  IGUIFont *pIVar6;
  int iVar7;
  long lVar8;
  wchar_t character;
  s32 i;
  uint uVar9;
  wchar_t c;
  int local_140;
  wchar_t local_13c;
  array<irr::core::string<wchar_t>_> *local_138;
  int local_12c;
  stringw word;
  stringw whitespace;
  stringw line;
  stringw first;
  stringw second;
  string<wchar_t> local_70;
  string<wchar_t> local_50;
  
  if (this->WordWrap == true) {
    local_138 = &this->BrokenText;
    core::array<irr::core::string<wchar_t>_>::clear(local_138);
    plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    pIVar6 = (IGUIFont *)(**(code **)(*(long *)this + 0x130))(this);
    if (pIVar6 != (IGUIFont *)0x0) {
      this->LastBreakFont = pIVar6;
      line.str._M_dataplus._M_p = (pointer)&line.str.field_2;
      line.str._M_string_length = 0;
      line.str.field_2._M_local_buf[0] = L'\0';
      word.str._M_dataplus._M_p = (pointer)&word.str.field_2;
      word.str._M_string_length = 0;
      word.str.field_2._M_local_buf[0] = L'\0';
      whitespace.str._M_dataplus._M_p = (pointer)&whitespace.str.field_2;
      whitespace.str._M_string_length = 0;
      whitespace.str.field_2._M_local_buf[0] = L'\0';
      uVar9 = *(uint *)&this->field_0xb0;
      iVar7 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      if (this->Border == true) {
        iVar3 = (**(code **)(*plVar5 + 0x10))(plVar5,8);
        iVar7 = iVar7 + iVar3 * -2;
      }
      this_00 = &this->field_0xa8;
      local_12c = iVar7;
      if (this->RightToLeft == false) {
        iVar7 = 0;
        for (lVar8 = 1; (long)(lVar8 - 1U) < (long)(int)uVar9; lVar8 = lVar8 + 1) {
          character = *(wchar_t *)(*(long *)this_00 + -4 + lVar8 * 4);
          if (character == L'\n') {
            local_13c = L'\0';
            character = L'\0';
            bVar1 = true;
            bVar2 = true;
LAB_00237a37:
            if ((int)word.str._M_string_length != 0) {
              iVar3 = (*pIVar6->_vptr_IGUIFont[1])(pIVar6,whitespace.str._M_dataplus._M_p);
              iVar4 = (*pIVar6->_vptr_IGUIFont[1])(pIVar6,word.str._M_dataplus._M_p);
              if (local_12c < iVar4) {
                begin = core::string<wchar_t>::findFirst(&word,L'­');
                if (begin == 0xffffffff) {
                  if (iVar7 != 0) {
LAB_00237b88:
                    core::array<irr::core::string<wchar_t>_>::push_back(local_138,&line);
                  }
                  core::string<wchar_t>::operator=(&line,&word);
                  iVar7 = iVar4;
                }
                else {
                  core::string<wchar_t>::subString(&first,&word,0,begin,false);
                  core::string<wchar_t>::subString
                            (&second,&word,begin,(int)word.str._M_string_length - begin,false);
                  core::string<wchar_t>::operator+(&local_70,&line,&first);
                  core::string<wchar_t>::operator+(&local_50,&local_70,L"-");
                  core::array<irr::core::string<wchar_t>_>::push_back(local_138,&local_50);
                  ::std::__cxx11::wstring::_M_dispose();
                  ::std::__cxx11::wstring::_M_dispose();
                  iVar7 = (*pIVar6->_vptr_IGUIFont[1])(pIVar6,second.str._M_dataplus._M_p);
                  core::string<wchar_t>::operator=(&line,&second);
                  ::std::__cxx11::wstring::_M_dispose();
                  ::std::__cxx11::wstring::_M_dispose();
                }
              }
              else {
                if (iVar7 == 0) {
                  iVar7 = iVar3 + iVar4;
                }
                else {
                  iVar7 = iVar7 + iVar3 + iVar4;
                  if (local_12c < iVar7) goto LAB_00237b88;
                }
                ::std::__cxx11::wstring::append((wstring *)&line);
                ::std::__cxx11::wstring::append((wstring *)&line);
              }
              core::string<wchar_t>::operator=(&word,L"");
              core::string<wchar_t>::operator=(&whitespace,L"");
            }
            if (bVar1) {
              core::string<wchar_t>::append(&whitespace,character);
            }
            if (bVar2) {
              ::std::__cxx11::wstring::append((wstring *)&line);
              ::std::__cxx11::wstring::append((wstring *)&line);
              core::array<irr::core::string<wchar_t>_>::push_back
                        (local_138,(string<wchar_t> *)&line);
              core::string<wchar_t>::operator=((string<wchar_t> *)&line,L"");
              core::string<wchar_t>::operator=(&word,L"");
              core::string<wchar_t>::operator=(&whitespace,L"");
              iVar7 = 0;
            }
          }
          else {
            if (character == L'\r') {
              if (*(int *)(*(long *)this_00 + lVar8 * 4) == 10) {
                core::string<wchar_t>::erase((string<wchar_t> *)this_00,(u32)lVar8);
                uVar9 = uVar9 - 1;
              }
              local_13c = L'\0';
              character = L'\0';
              bVar1 = true;
              bVar2 = true;
              goto LAB_00237a37;
            }
            if ((character & 0xffffffdfU) == 0) {
              bVar1 = true;
LAB_00237a2a:
              bVar2 = false;
              goto LAB_00237a37;
            }
            core::string<wchar_t>::append(&word,character);
            if (lVar8 - 1U == (ulong)(uVar9 - 1)) {
              bVar1 = false;
              goto LAB_00237a2a;
            }
          }
        }
        ::std::__cxx11::wstring::append((wstring *)&line);
        ::std::__cxx11::wstring::append((wstring *)&line);
      }
      else {
        local_140 = 0;
        for (; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
          local_13c = *(wchar_t *)(*(long *)this_00 + (ulong)uVar9 * 4);
          bVar1 = false;
          if (local_13c == L'\n') {
LAB_002376e8:
            local_13c = L'\0';
            bVar1 = true;
          }
          else if (local_13c == L'\r') {
            if ((uVar9 != 0) && (*(int *)(*(long *)this_00 + (ulong)(uVar9 - 1) * 4) == 10)) {
              core::string<wchar_t>::erase((string<wchar_t> *)this_00,uVar9 - 1);
            }
            goto LAB_002376e8;
          }
          if ((uVar9 == 0) || ((local_13c & 0xffffffdfU) == 0)) {
            if ((int)word.str._M_string_length != 0) {
              iVar7 = (*pIVar6->_vptr_IGUIFont[1])(pIVar6,whitespace.str._M_dataplus._M_p);
              iVar3 = (*pIVar6->_vptr_IGUIFont[1])(pIVar6,word.str._M_dataplus._M_p);
              if (local_140 == 0) {
                iVar7 = iVar7 + iVar3;
LAB_002377cc:
                iVar3 = iVar7;
                core::string<wchar_t>::operator+(&first,&whitespace,&line);
                core::string<wchar_t>::operator=(&line,&first);
                ::std::__cxx11::wstring::_M_dispose();
                core::string<wchar_t>::operator+(&first,&word,&line);
                core::string<wchar_t>::operator=(&line,&first);
                ::std::__cxx11::wstring::_M_dispose();
              }
              else {
                iVar7 = local_140 + iVar7 + iVar3;
                if (iVar7 <= local_12c) goto LAB_002377cc;
                core::array<irr::core::string<wchar_t>_>::push_back(local_138,&line);
                core::string<wchar_t>::operator=(&line,&word);
              }
              core::string<wchar_t>::operator=(&word,L"");
              core::string<wchar_t>::operator=(&whitespace,L"");
              local_140 = iVar3;
            }
            if (local_13c != L'\0') {
              core::string<wchar_t>::string<wchar_t>(&second,&local_13c,1);
              core::string<wchar_t>::operator+(&first,&second,&whitespace);
              core::string<wchar_t>::operator=(&whitespace,&first);
              ::std::__cxx11::wstring::_M_dispose();
              ::std::__cxx11::wstring::_M_dispose();
            }
            if (bVar1) {
              core::string<wchar_t>::operator+(&first,&whitespace,&line);
              core::string<wchar_t>::operator=(&line,&first);
              ::std::__cxx11::wstring::_M_dispose();
              core::string<wchar_t>::operator+(&first,&word,&line);
              core::string<wchar_t>::operator=(&line,&first);
              ::std::__cxx11::wstring::_M_dispose();
              core::array<irr::core::string<wchar_t>_>::push_back(local_138,&line);
              core::string<wchar_t>::operator=(&line,L"");
              core::string<wchar_t>::operator=(&word,L"");
              core::string<wchar_t>::operator=(&whitespace,L"");
              local_140 = 0;
            }
          }
          else {
            core::string<wchar_t>::string<wchar_t>(&second,&local_13c,1);
            core::string<wchar_t>::operator+(&first,&second,&word);
            core::string<wchar_t>::operator=(&word,&first);
            ::std::__cxx11::wstring::_M_dispose();
            ::std::__cxx11::wstring::_M_dispose();
          }
        }
        core::string<wchar_t>::operator+(&first,&whitespace,&line);
        core::string<wchar_t>::operator=(&line,&first);
        ::std::__cxx11::wstring::_M_dispose();
        core::string<wchar_t>::operator+(&first,&word,&line);
        core::string<wchar_t>::operator=(&line,&first);
        ::std::__cxx11::wstring::_M_dispose();
      }
      core::array<irr::core::string<wchar_t>_>::push_back(local_138,&line);
      ::std::__cxx11::wstring::_M_dispose();
      ::std::__cxx11::wstring::_M_dispose();
      ::std::__cxx11::wstring::_M_dispose();
    }
  }
  return;
}

Assistant:

void CGUIStaticText::breakText()
{
	if (!WordWrap)
		return;

	BrokenText.clear();

	IGUISkin *skin = Environment->getSkin();
	IGUIFont *font = getActiveFont();
	if (!font)
		return;

	LastBreakFont = font;

	core::stringw line;
	core::stringw word;
	core::stringw whitespace;
	s32 size = Text.size();
	s32 length = 0;
	s32 elWidth = RelativeRect.getWidth();
	if (Border)
		elWidth -= 2 * skin->getSize(EGDS_TEXT_DISTANCE_X);
	wchar_t c;

	// We have to deal with right-to-left and left-to-right differently
	// However, most parts of the following code is the same, it's just
	// some order and boundaries which change.
	if (!RightToLeft) {
		// regular (left-to-right)
		for (s32 i = 0; i < size; ++i) {
			c = Text[i];
			bool lineBreak = false;

			if (c == L'\r') { // Mac or Windows breaks
				lineBreak = true;
				if (Text[i + 1] == L'\n') { // Windows breaks
					Text.erase(i + 1);
					--size;
				}
				c = '\0';
			} else if (c == L'\n') { // Unix breaks
				lineBreak = true;
				c = '\0';
			}

			bool isWhitespace = (c == L' ' || c == 0);
			if (!isWhitespace) {
				// part of a word
				word += c;
			}

			if (isWhitespace || i == (size - 1)) {
				if (word.size()) {
					// here comes the next whitespace, look if
					// we must break the last word to the next line.
					const s32 whitelgth = font->getDimension(whitespace.c_str()).Width;
					const s32 wordlgth = font->getDimension(word.c_str()).Width;

					if (wordlgth > elWidth) {
						// This word is too long to fit in the available space, look for
						// the Unicode Soft HYphen (SHY / 00AD) character for a place to
						// break the word at
						int where = word.findFirst(wchar_t(0x00AD));
						if (where != -1) {
							core::stringw first = word.subString(0, where);
							core::stringw second = word.subString(where, word.size() - where);
							BrokenText.push_back(line + first + L"-");
							const s32 secondLength = font->getDimension(second.c_str()).Width;

							length = secondLength;
							line = second;
						} else {
							// No soft hyphen found, so there's nothing more we can do
							// break to next line
							if (length)
								BrokenText.push_back(line);
							length = wordlgth;
							line = word;
						}
					} else if (length && (length + wordlgth + whitelgth > elWidth)) {
						// break to next line
						BrokenText.push_back(line);
						length = wordlgth;
						line = word;
					} else {
						// add word to line
						line += whitespace;
						line += word;
						length += whitelgth + wordlgth;
					}

					word = L"";
					whitespace = L"";
				}

				if (isWhitespace) {
					whitespace += c;
				}

				// compute line break
				if (lineBreak) {
					line += whitespace;
					line += word;
					BrokenText.push_back(line);
					line = L"";
					word = L"";
					whitespace = L"";
					length = 0;
				}
			}
		}

		line += whitespace;
		line += word;
		BrokenText.push_back(line);
	} else {
		// right-to-left
		for (s32 i = size; i >= 0; --i) {
			c = Text[i];
			bool lineBreak = false;

			if (c == L'\r') { // Mac or Windows breaks
				lineBreak = true;
				if ((i > 0) && Text[i - 1] == L'\n') { // Windows breaks
					Text.erase(i - 1);
					--size;
				}
				c = '\0';
			} else if (c == L'\n') { // Unix breaks
				lineBreak = true;
				c = '\0';
			}

			if (c == L' ' || c == 0 || i == 0) {
				if (word.size()) {
					// here comes the next whitespace, look if
					// we must break the last word to the next line.
					const s32 whitelgth = font->getDimension(whitespace.c_str()).Width;
					const s32 wordlgth = font->getDimension(word.c_str()).Width;

					if (length && (length + wordlgth + whitelgth > elWidth)) {
						// break to next line
						BrokenText.push_back(line);
						length = wordlgth;
						line = word;
					} else {
						// add word to line
						line = whitespace + line;
						line = word + line;
						length += whitelgth + wordlgth;
					}

					word = L"";
					whitespace = L"";
				}

				if (c != 0)
					whitespace = core::stringw(&c, 1) + whitespace;

				// compute line break
				if (lineBreak) {
					line = whitespace + line;
					line = word + line;
					BrokenText.push_back(line);
					line = L"";
					word = L"";
					whitespace = L"";
					length = 0;
				}
			} else {
				// yippee this is a word..
				word = core::stringw(&c, 1) + word;
			}
		}

		line = whitespace + line;
		line = word + line;
		BrokenText.push_back(line);
	}
}